

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::flush_phi(CompilerGLSL *this,BlockID from,BlockID to)

{
  VariableID *ts_1;
  uint uVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  SPIRBlock *pSVar5;
  SPIRVariable *pSVar6;
  Phi *pPVar7;
  SPIRType *type;
  __hash_code __code;
  Phi *pPVar8;
  Phi *pPVar9;
  long lVar10;
  ulong uVar11;
  Phi *ts;
  long lVar12;
  size_t sVar13;
  Phi *pPVar14;
  string lhs;
  string rhs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  temporary_phi_variables;
  undefined1 local_d0 [32];
  string local_b0;
  SPIRBlock *local_90;
  string local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pSVar5 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + to.id);
  if ((pSVar5->ignore_phi_from_block).id != from.id) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    sVar13 = (pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
             buffer_size;
    if (sVar13 != 0) {
      pPVar9 = (pSVar5->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr;
      pPVar14 = pPVar9 + 3;
      ts = pPVar9;
      local_90 = pSVar5;
      do {
        if ((ts->parent).id == from.id) {
          pSVar6 = Variant::get<diligent_spirv_cross::SPIRVariable>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              (ts->function_variable).id);
          ts_1 = &ts->function_variable;
          if ((pSVar6->loop_variable == true) && (pSVar6->loop_variable_enable == false)) {
            (pSVar6->static_expression).id = (ts->local_variable).id;
          }
          else {
            flush_variable_declaration(this,ts_1->id);
            pPVar7 = (local_90->phi_variables).
                     super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr +
                     (local_90->phi_variables).
                     super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.buffer_size;
            pPVar9 = ts + 1;
            lVar10 = (long)pPVar7 - (long)pPVar9;
            lVar12 = (lVar10 >> 2) * -0x5555555555555555 >> 2;
            pPVar8 = pPVar9;
            if (0 < lVar12) {
              uVar2 = ts_1->id;
              lVar10 = lVar12 + 1;
              pPVar8 = pPVar14;
              do {
                if ((pPVar8[-2].local_variable.id == uVar2) && (pPVar8[-2].parent.id == from.id)) {
                  pPVar8 = pPVar8 + -2;
                  goto LAB_00769de6;
                }
                if ((pPVar8[-1].local_variable.id == uVar2) && (pPVar8[-1].parent.id == from.id)) {
                  pPVar8 = pPVar8 + -1;
                  goto LAB_00769de6;
                }
                if (((pPVar8->local_variable).id == uVar2) && ((pPVar8->parent).id == from.id))
                goto LAB_00769de6;
                if ((pPVar8[1].local_variable.id == uVar2) && (pPVar8[1].parent.id == from.id)) {
                  pPVar8 = pPVar8 + 1;
                  goto LAB_00769de6;
                }
                lVar10 = lVar10 + -1;
                pPVar8 = pPVar8 + 4;
              } while (1 < lVar10);
              lVar10 = (long)pPVar7 - (long)(pPVar9 + lVar12 * 4);
              pPVar8 = pPVar9 + lVar12 * 4;
            }
            lVar10 = (lVar10 >> 2) * -0x5555555555555555;
            if (lVar10 == 3) {
              uVar2 = (pPVar8->local_variable).id;
              uVar1 = ts_1->id;
              if ((uVar2 != uVar1) || ((pPVar8->parent).id != from.id)) {
                pPVar8 = pPVar8 + 1;
                goto LAB_00769daf;
              }
LAB_00769de6:
              uVar11 = (ulong)uVar2;
LAB_00769deb:
              if (pPVar8 != pPVar7) {
                if (pSVar6->allocate_temporary_copy == false) {
                  pSVar6->allocate_temporary_copy = true;
                  Compiler::force_recompile(&this->super_Compiler);
                  uVar11 = (ulong)ts_1->id;
                }
                (*(this->super_Compiler)._vptr_Compiler[6])
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0,this,uVar11,1);
                statement<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                          (this,(char (*) [2])0x920159,ts_1,(char (*) [6])0x80e1fc,
                           (char (*) [4])0x8fb3ab,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0,(char (*) [2])0x91f319);
                if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_d0._0_8_ !=
                    (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_d0 + 0x10)) {
                  operator_delete((void *)local_d0._0_8_);
                }
                local_b0._M_dataplus._M_p._0_4_ = ts_1->id;
                local_d0._0_8_ = &local_68;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          (local_d0._0_8_,
                           (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&local_b0,local_d0);
              }
            }
            else {
              if (lVar10 == 2) {
                uVar1 = ts_1->id;
LAB_00769daf:
                uVar11 = (ulong)uVar1;
                if (((pPVar8->local_variable).id != uVar1) || ((pPVar8->parent).id != from.id)) {
                  pPVar8 = pPVar8 + 1;
                  goto LAB_00769dc1;
                }
                goto LAB_00769deb;
              }
              if (lVar10 == 1) {
                uVar11 = (ulong)ts_1->id;
LAB_00769dc1:
                if (((pPVar8->local_variable).id == (uint32_t)uVar11) &&
                   ((pPVar8->parent).id == from.id)) goto LAB_00769deb;
              }
            }
            to_expression_abi_cxx11_((string *)local_d0,this,ts_1->id,true);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            local_b0._M_string_length = 0;
            local_b0.field_2._M_local_buf[0] = '\0';
            uVar2 = (ts->local_variable).id;
            if (local_68._M_buckets[(ulong)uVar2 % local_68._M_bucket_count] != (__node_base_ptr)0x0
               ) {
              p_Var3 = local_68._M_buckets[(ulong)uVar2 % local_68._M_bucket_count]->_M_nxt;
              uVar1 = *(uint *)&p_Var3[1]._M_nxt;
              do {
                if (uVar2 == uVar1) {
                  join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>&,char_const(&)[6]>
                            (&local_88,(diligent_spirv_cross *)0x920159,(char (*) [2])ts,
                             (TypedID<(diligent_spirv_cross::Types)0> *)0x80e1fc,
                             (char (*) [6])local_68._M_bucket_count);
                  goto LAB_00769f4d;
                }
                p_Var3 = p_Var3->_M_nxt;
              } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                      (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                      (ulong)uVar1 % local_68._M_bucket_count ==
                      (ulong)uVar2 % local_68._M_bucket_count));
            }
            to_pointer_expression_abi_cxx11_(&local_88,this,uVar2,true);
LAB_00769f4d:
            ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
            }
            type = Variant::get<diligent_spirv_cross::SPIRType>
                             ((this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>.ptr +
                              *(uint *)&(pSVar6->super_IVariant).field_0xc);
            bVar4 = optimize_read_modify_write(this,type,(string *)local_d0,&local_b0);
            if (!bVar4) {
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,(char (*) [4])0x8fb3ab,&local_b0,(char (*) [2])0x91f319);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d0._0_8_ !=
                (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_d0 + 0x10)) {
              operator_delete((void *)local_d0._0_8_);
            }
          }
          Compiler::register_write(&this->super_Compiler,ts_1->id);
          pPVar9 = (local_90->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                   ptr;
          sVar13 = (local_90->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                   buffer_size;
        }
        ts = ts + 1;
        pPVar14 = pPVar14 + 1;
      } while (ts != pPVar9 + sVar13);
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_phi(BlockID from, BlockID to)
{
	auto &child = get<SPIRBlock>(to);
	if (child.ignore_phi_from_block == from)
		return;

	unordered_set<uint32_t> temporary_phi_variables;

	for (auto itr = begin(child.phi_variables); itr != end(child.phi_variables); ++itr)
	{
		auto &phi = *itr;

		if (phi.parent == from)
		{
			auto &var = get<SPIRVariable>(phi.function_variable);

			// A Phi variable might be a loop variable, so flush to static expression.
			if (var.loop_variable && !var.loop_variable_enable)
				var.static_expression = phi.local_variable;
			else
			{
				flush_variable_declaration(phi.function_variable);

				// Check if we are going to write to a Phi variable that another statement will read from
				// as part of another Phi node in our target block.
				// For this case, we will need to copy phi.function_variable to a temporary, and use that for future reads.
				// This is judged to be extremely rare, so deal with it here using a simple, but suboptimal algorithm.
				bool need_saved_temporary =
				    find_if(itr + 1, end(child.phi_variables), [&](const SPIRBlock::Phi &future_phi) -> bool {
					    return future_phi.local_variable == ID(phi.function_variable) && future_phi.parent == from;
				    }) != end(child.phi_variables);

				if (need_saved_temporary)
				{
					// Need to make sure we declare the phi variable with a copy at the right scope.
					// We cannot safely declare a temporary here since we might be inside a continue block.
					if (!var.allocate_temporary_copy)
					{
						var.allocate_temporary_copy = true;
						force_recompile();
					}
					statement("_", phi.function_variable, "_copy", " = ", to_name(phi.function_variable), ";");
					temporary_phi_variables.insert(phi.function_variable);
				}

				// This might be called in continue block, so make sure we
				// use this to emit ESSL 1.0 compliant increments/decrements.
				auto lhs = to_expression(phi.function_variable);

				string rhs;
				if (temporary_phi_variables.count(phi.local_variable))
					rhs = join("_", phi.local_variable, "_copy");
				else
					rhs = to_pointer_expression(phi.local_variable);

				if (!optimize_read_modify_write(get<SPIRType>(var.basetype), lhs, rhs))
					statement(lhs, " = ", rhs, ";");
			}

			register_write(phi.function_variable);
		}
	}
}